

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# security_materials.cpp
# Opt level: O0

bool __thiscall
ot::commissioner::security_material::SecurityMaterials::IsEmpty(SecurityMaterials *this,bool isCCM)

{
  size_type sVar1;
  bool local_22;
  bool local_21;
  bool isCCM_local;
  SecurityMaterials *this_local;
  
  if (isCCM) {
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->mCertificate);
    local_21 = false;
    if (sVar1 == 0) {
      sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->mPrivateKey);
      local_21 = false;
      if (sVar1 == 0) {
        sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          (&this->mTrustAnchor);
        local_21 = false;
        if (sVar1 == 0) {
          sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            (&this->mCommissionerToken);
          local_21 = sVar1 == 0;
        }
      }
    }
    local_22 = local_21;
  }
  else {
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->mPSKc);
    local_22 = sVar1 == 0;
  }
  return local_22;
}

Assistant:

bool SecurityMaterials::IsEmpty(bool isCCM) const
{
    return isCCM ? mCertificate.size() == 0 && mPrivateKey.size() == 0 && mTrustAnchor.size() == 0 &&
                       mCommissionerToken.size() == 0
                 : mPSKc.size() == 0;
}